

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Write<unsigned_long_long>(KDataStream *this,unsigned_long_long T)

{
  NetToDataType<unsigned_long_long> local_2a;
  byte local_29;
  NetToDataType<unsigned_long_long> local_28 [7];
  KUINT8 i;
  NetToDataType<unsigned_long_long> OctArray;
  unsigned_long_long uStack_18;
  KBOOL bSwapBytes;
  unsigned_long_long T_local;
  KDataStream *this_local;
  
  OctArray.field_0.m_Octs[7] = this->m_MachineEndian != this->m_NetEndian;
  uStack_18 = T;
  T_local = (unsigned_long_long)this;
  NetToDataType<unsigned_long_long>::NetToDataType(local_28,T,(KBOOL)OctArray.field_0.m_Octs[7]);
  for (local_29 = 0; local_29 < 8; local_29 = local_29 + 1) {
    local_2a = local_28[local_29];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vBuffer,(value_type_conflict *)&local_2a);
  }
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}